

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall
GameEngine::populationSplit
          (GameEngine *this,shared_ptr<Population> *population,int32_t destination_x,
          int32_t destination_y)

{
  int32_t iVar1;
  element_type *peVar2;
  element_type *this_00;
  element_type *this_01;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *this_02;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  element_type *this_04;
  __shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_05;
  element_type *this_06;
  shared_ptr<Population> local_60;
  shared_ptr<Population> local_50 [2];
  undefined1 local_30 [8];
  shared_ptr<Population> new_population;
  int32_t destination_y_local;
  int32_t destination_x_local;
  shared_ptr<Population> *population_local;
  GameEngine *this_local;
  
  new_population.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
       = destination_y;
  new_population.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = destination_x;
  peVar2 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      population);
  this_00 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       population);
  iVar1 = Population::GetAnimalAmount(this_00);
  Population::SetAnimalAmount(peVar2,iVar1 / 2);
  std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)population
            );
  std::make_shared<Population,Population&>((Population *)local_30);
  this_01 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                      ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  this_02 = Map::operator[](this_01,(long)(int32_t)new_population.
                                                                                                      
                                                  super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
  this_03 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
            operator[](this_02,(long)new_population.
                                     super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi._4_4_);
  this_04 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      (this_03);
  std::shared_ptr<Population>::shared_ptr(local_50,(shared_ptr<Population> *)local_30);
  CellType::setCurrentPopulation(this_04,local_50);
  std::shared_ptr<Population>::~shared_ptr(local_50);
  peVar2 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  Population::SetXPos(peVar2,new_population.
                             super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_);
  peVar2 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_30);
  Population::SetYPos(peVar2,(int32_t)new_population.
                                      super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi);
  this_05 = (__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::
            operator[](&this->players,(long)this->currentPlayer);
  this_06 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      (this_05);
  std::shared_ptr<Population>::shared_ptr(&local_60,(shared_ptr<Population> *)local_30);
  Player::addNewPopulation(this_06,&local_60);
  std::shared_ptr<Population>::~shared_ptr(&local_60);
  std::shared_ptr<Population>::~shared_ptr((shared_ptr<Population> *)local_30);
  return;
}

Assistant:

void GameEngine::populationSplit(std::shared_ptr<Population> population, int32_t destination_x, int32_t destination_y) {
  population->SetAnimalAmount(population->GetAnimalAmount() / 2);
  std::shared_ptr<Population> new_population = std::make_shared<Population>(*(population));

  (*map)[destination_y][destination_x]->setCurrentPopulation(new_population);

  new_population->SetXPos(destination_x);
  new_population->SetYPos(destination_y);
  players[currentPlayer]->addNewPopulation(new_population);
}